

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O3

void __thiscall
BMRS_XZ<UFPC>::FindRuns
          (BMRS_XZ<UFPC> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t *flag_bits;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  unsigned_short uVar9;
  uint uVar10;
  uint uVar11;
  uint64_t uVar12;
  long lVar13;
  uint uVar14;
  Run *pRVar15;
  ulong *puVar16;
  Run *pRVar17;
  Run *pRVar18;
  unsigned_short uVar19;
  ulong uVar20;
  short sVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  
  puVar8 = UFPC::P_;
  lVar13 = (long)data_width;
  uVar20 = *bits_start;
  sVar21 = 0;
  puVar16 = bits_start;
  pRVar18 = runs;
  while( true ) {
    for (; uVar20 != 0; uVar20 = (~uVar20 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f)) {
      lVar5 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      pRVar18->start_pos = (short)lVar5 + sVar21;
      uVar20 = (~uVar20 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f);
      if (uVar20 == 0) {
        do {
          sVar21 = sVar21 + 0x40;
          puVar1 = puVar16 + 1;
          puVar16 = puVar16 + 1;
        } while (*puVar1 == 0xffffffffffffffff);
        uVar20 = ~*puVar1;
      }
      lVar5 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      pRVar18->end_pos = (short)lVar5 + sVar21;
      puVar8[UFPC::length_] = UFPC::length_;
      uVar11 = UFPC::length_ + 1;
      pRVar18->label = UFPC::length_;
      UFPC::length_ = uVar11;
      pRVar18 = pRVar18 + 1;
    }
    puVar16 = puVar16 + 1;
    if (puVar16 == bits_start + lVar13) break;
    sVar21 = sVar21 + 0x40;
    uVar20 = *puVar16;
  }
  pRVar18->start_pos = 0xffff;
  pRVar18->end_pos = 0xffff;
  if (height < 2) {
LAB_00247bc4:
    puVar8 = UFPC::P_;
    uVar11 = 1;
    if (1 < UFPC::length_) {
      uVar11 = 1;
      uVar20 = 1;
      do {
        if (puVar8[uVar20] < uVar20) {
          uVar10 = puVar8[puVar8[uVar20]];
        }
        else {
          uVar10 = uVar11;
          uVar11 = uVar11 + 1;
        }
        puVar8[uVar20] = uVar10;
        uVar20 = uVar20 + 1;
      } while (uVar20 < UFPC::length_);
    }
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
    return;
  }
  uVar20 = 1;
LAB_002478d7:
  pRVar15 = pRVar18 + 1;
  flag_bits = bits_flag + (uVar20 - 1) * lVar13;
  puVar16 = bits_start + uVar20 * lVar13;
  puVar1 = puVar16 + lVar13;
  uVar24 = *puVar16;
  lVar5 = 0;
  pRVar18 = pRVar15;
  do {
    for (; uVar24 != 0; uVar24 = ~uVar24 & -1L << ((byte)lVar7 & 0x3f)) {
      lVar6 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar24 = (~uVar24 >> ((byte)lVar6 & 0x3f)) << ((byte)lVar6 & 0x3f);
      lVar23 = lVar5;
      if (uVar24 == 0) {
        do {
          lVar23 = lVar23 + 0x40;
          puVar2 = puVar16 + 1;
          puVar16 = puVar16 + 1;
        } while (*puVar2 == 0xffffffffffffffff);
        uVar24 = ~*puVar2;
      }
      lVar7 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      uVar11 = (uint)(lVar5 + lVar6);
      uVar10 = uVar11 & 0xffff;
      pRVar17 = runs;
      do {
        runs = pRVar17;
        uVar3 = runs->end_pos;
        pRVar17 = runs + 1;
      } while (uVar3 < uVar10);
      uVar4 = runs->start_pos;
      uVar19 = (unsigned_short)(lVar7 + lVar23);
      uVar22 = (uint)(lVar7 + lVar23) & 0xffff;
      uVar9 = (unsigned_short)(lVar5 + lVar6);
      if (uVar22 < uVar4) {
        pRVar18->start_pos = uVar9;
        pRVar18->end_pos = uVar19;
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar11 = UFPC::length_ + 1;
        pRVar18->label = UFPC::length_;
        UFPC::length_ = uVar11;
      }
      else {
        uVar14 = (uint)uVar4;
        if (uVar4 <= uVar10) {
          uVar14 = uVar11;
        }
        if (uVar3 < uVar22) {
          uVar12 = is_connected(this,flag_bits,uVar14 & 0xffff,(uint)uVar3);
          if (uVar12 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = UFPC::P_[runs->label];
          }
          uVar3 = pRVar17->start_pos;
          runs = pRVar17;
          while (uVar10 = uVar11, uVar3 <= uVar22) {
            if (uVar22 <= runs->end_pos) {
              uVar12 = is_connected(this,flag_bits,(uint)uVar3,uVar22);
              if (((uVar12 != 0) && (uVar22 = UFPC::P_[runs->label], uVar11 != uVar22)) &&
                 (uVar10 = uVar22, uVar11 != 0)) {
                uVar10 = UFPC::Merge(uVar11,uVar22);
              }
              break;
            }
            uVar12 = is_connected(this,flag_bits,(uint)uVar3,(uint)runs->end_pos);
            if (((uVar12 != 0) && (uVar14 = UFPC::P_[runs->label], uVar11 != uVar14)) &&
               (uVar10 = uVar14, uVar11 != 0)) {
              uVar10 = UFPC::Merge(uVar11,uVar14);
            }
            pRVar17 = runs + 1;
            runs = runs + 1;
            uVar11 = uVar10;
            uVar3 = pRVar17->start_pos;
          }
          if (uVar10 == 0) {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar10 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          pRVar18->label = uVar10;
          pRVar18->start_pos = uVar9;
          pRVar18->end_pos = uVar19;
        }
        else {
          uVar12 = is_connected(this,flag_bits,uVar14 & 0xffff,uVar22);
          if (uVar12 == 0) {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar11 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else {
            uVar11 = UFPC::P_[runs->label];
          }
          pRVar18->label = uVar11;
          pRVar18->start_pos = uVar9;
          pRVar18->end_pos = uVar19;
        }
      }
      pRVar18 = pRVar18 + 1;
      lVar5 = lVar23;
    }
    puVar16 = puVar16 + 1;
    if (puVar16 == puVar1) break;
    uVar24 = *puVar16;
    lVar5 = lVar5 + 0x40;
  } while( true );
  pRVar18->start_pos = 0xffff;
  pRVar18->end_pos = 0xffff;
  uVar20 = uVar20 + 1;
  runs = pRVar15;
  if (uVar20 == (uint)height) goto LAB_00247bc4;
  goto LAB_002478d7;
}

Assistant:

void FindRuns(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
        out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::GetLabel(runs_up->label);
                    else runs->label = LabelsSolver::NewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::GetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::NewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }